

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# append_data.hpp
# Opt level: O1

void duckdb::ResizeValidity(ArrowBuffer *buffer,idx_t row_count)

{
  ulong uVar1;
  ulong bytes;
  
  bytes = row_count + 7 >> 3;
  ArrowBuffer::reserve(buffer,bytes);
  uVar1 = buffer->count;
  if (uVar1 < bytes) {
    do {
      buffer->dataptr[uVar1] = 0xff;
      uVar1 = uVar1 + 1;
    } while (bytes != uVar1);
  }
  buffer->count = bytes;
  return;
}

Assistant:

static void ResizeValidity(ArrowBuffer &buffer, idx_t row_count) {
	auto byte_count = (row_count + 7) / 8;
	buffer.resize(byte_count, 0xFF);
}